

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxError ChunkAppend(WebPChunk *chunk,WebPChunk ***chunk_list)

{
  long lVar1;
  WebPChunk **in_RSI;
  WebPChunk *in_RDI;
  WebPChunk *last_chunk;
  undefined8 local_18;
  
  lVar1._0_4_ = (*in_RSI)->tag_;
  lVar1._4_4_ = (*in_RSI)->owner_;
  if (lVar1 == 0) {
    ChunkSetHead(in_RDI,in_RSI);
  }
  else {
    local_18._0_4_ = (*in_RSI)->tag_;
    local_18._4_4_ = (*in_RSI)->owner_;
    for (; *(long *)(local_18 + 0x18) != 0; local_18 = *(long *)(local_18 + 0x18)) {
    }
    ChunkSetHead(in_RDI,in_RSI);
    *in_RSI = (WebPChunk *)(local_18 + 0x18);
  }
  return WEBP_MUX_OK;
}

Assistant:

WebPMuxError ChunkAppend(WebPChunk* const chunk,
                         WebPChunk*** const chunk_list) {
  assert(chunk_list != NULL && *chunk_list != NULL);

  if (**chunk_list == NULL) {
    ChunkSetHead(chunk, *chunk_list);
  } else {
    WebPChunk* last_chunk = **chunk_list;
    while (last_chunk->next_ != NULL) last_chunk = last_chunk->next_;
    ChunkSetHead(chunk, &last_chunk->next_);
    *chunk_list = &last_chunk->next_;
  }
  return WEBP_MUX_OK;
}